

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomcmd(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  matches *pmVar2;
  expr *peVar3;
  expr **ppeVar4;
  int iVar5;
  
  if (ctx->reverse != 0) {
    pmVar2 = matchid(ctx,spos,(char *)v);
    return pmVar2;
  }
  peVar3 = (expr *)calloc(0x48,1);
  peVar3->type = EXPR_ID;
  peVar3->str = (char *)v;
  peVar3->special = 1;
  iVar5 = ctx->atomsnum;
  iVar1 = ctx->atomsmax;
  if (iVar5 < iVar1) {
    ppeVar4 = ctx->atoms;
  }
  else {
    iVar5 = 0x10;
    if (iVar1 != 0) {
      iVar5 = iVar1 * 2;
    }
    ctx->atomsmax = iVar5;
    ppeVar4 = (expr **)realloc(ctx->atoms,(long)iVar5 << 3);
    ctx->atoms = ppeVar4;
    iVar5 = ctx->atomsnum;
  }
  ctx->atomsnum = iVar5 + 1;
  ppeVar4[iVar5] = peVar3;
  return (matches *)0x0;
}

Assistant:

struct matches *atomcmd APROTO {
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_ID);
		expr->str = v;
		expr->special = 1;
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		return matchid(ctx, spos, v);
	}
}